

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::ResultBuilder::translateException(ResultBuilder *this)

{
  String local_28;
  ResultBuilder *local_10;
  ResultBuilder *this_local;
  
  (this->super_AssertData).m_threw = true;
  local_10 = this;
  anon_unknown_15::translateActiveException();
  String::operator=(&(this->super_AssertData).m_exception,&local_28);
  String::~String(&local_28);
  return;
}

Assistant:

void ResultBuilder::translateException() {
        m_threw     = true;
        m_exception = translateActiveException();
    }